

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_index.cpp
# Opt level: O0

int32_t __thiscall cornelich::vanilla_index::find_first_cycle(vanilla_index *this)

{
  type_conflict1 tVar1;
  bool bVar2;
  int32_t iVar3;
  int iVar4;
  string *psVar5;
  cycle_formatter *this_00;
  int32_t local_13c;
  path local_d8;
  int32_t local_b4;
  reference pdStack_b0;
  int32_t date;
  directory_entry *entry;
  directory_iterator __end1;
  directory_iterator __begin1;
  directory_iterator local_90;
  iterator_range<boost::filesystem::directory_iterator> local_88;
  iterator_range<boost::filesystem::directory_iterator> *local_78;
  iterator_range<boost::filesystem::directory_iterator> *__range1;
  directory_iterator local_60;
  directory_iterator end;
  directory_iterator local_38;
  directory_iterator begin;
  error_code err;
  int first_cycle;
  vanilla_index *this_local;
  
  err.cat_._4_4_ = std::numeric_limits<int>::max();
  boost::system::error_code::error_code((error_code *)&begin);
  psVar5 = vanilla_chronicle_settings::path_abi_cxx11_(this->m_settings);
  boost::filesystem::path::path((path *)&end,psVar5);
  boost::filesystem::directory_iterator::directory_iterator
            (&local_38,(path *)&end,(error_code *)&begin);
  boost::filesystem::path::~path((path *)&end);
  boost::filesystem::directory_iterator::directory_iterator(&local_60);
  tVar1 = boost::iterators::operator==
                    ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                      *)&local_38,
                     (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                      *)&local_60);
  if (tVar1) {
    this_local._4_4_ = -1;
  }
  else {
    boost::filesystem::directory_iterator::directory_iterator(&local_90,&local_38);
    boost::filesystem::directory_iterator::directory_iterator(&__begin1,&local_60);
    boost::make_iterator_range<boost::filesystem::directory_iterator>
              ((boost *)&local_88,&local_90,&__begin1);
    boost::filesystem::directory_iterator::~directory_iterator(&__begin1);
    boost::filesystem::directory_iterator::~directory_iterator(&local_90);
    local_78 = &local_88;
    boost::iterator_range_detail::
    iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
    ::begin((iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
             *)&__end1);
    boost::iterator_range_detail::
    iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
    ::end((iterator_range_base<boost::filesystem::directory_iterator,_boost::iterators::incrementable_traversal_tag>
           *)&entry);
    while (tVar1 = boost::iterators::operator!=
                             ((iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                               *)&__end1,
                              (iterator_facade<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long>
                               *)&entry), tVar1) {
      pdStack_b0 = boost::iterators::detail::
                   iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                   ::operator*((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                                *)&__end1);
      bVar2 = boost::filesystem::is_directory(pdStack_b0);
      if (bVar2) {
        this_00 = vanilla_chronicle_settings::cycle_format(this->m_settings);
        boost::filesystem::directory_entry::path(pdStack_b0);
        boost::filesystem::path::filename();
        psVar5 = boost::filesystem::path::string_abi_cxx11_(&local_d8);
        iVar3 = cycle_formatter::cycle_from_date(this_00,psVar5);
        boost::filesystem::path::~path(&local_d8);
        local_b4 = iVar3;
        if (iVar3 < err.cat_._4_4_) {
          err.cat_._4_4_ = iVar3;
        }
      }
      boost::iterators::detail::
      iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
      ::operator++((iterator_facade_base<boost::filesystem::directory_iterator,_boost::filesystem::directory_entry,_boost::iterators::single_pass_traversal_tag,_boost::filesystem::directory_entry_&,_long,_false,_false>
                    *)&__end1);
    }
    __range1._0_4_ = 2;
    boost::filesystem::directory_iterator::~directory_iterator((directory_iterator *)&entry);
    boost::filesystem::directory_iterator::~directory_iterator(&__end1);
    boost::iterator_range<boost::filesystem::directory_iterator>::~iterator_range(&local_88);
    iVar4 = std::numeric_limits<int>::max();
    if (err.cat_._4_4_ == iVar4) {
      local_13c = -1;
    }
    else {
      local_13c = err.cat_._4_4_;
    }
    this_local._4_4_ = local_13c;
  }
  __range1._0_4_ = 1;
  boost::filesystem::directory_iterator::~directory_iterator(&local_60);
  boost::filesystem::directory_iterator::~directory_iterator(&local_38);
  return this_local._4_4_;
}

Assistant:

std::int32_t vanilla_index::find_first_cycle() const
{
    auto first_cycle = std::numeric_limits<std::int32_t>::max();
    boost::system::error_code err;
    fs::directory_iterator begin(m_settings.path(), err);
    fs::directory_iterator end;

    // No directories -> empty
    if(begin == end)
        return -1;

    // Find the earliest directory
    for(const auto & entry : boost::make_iterator_range(begin, end))
    {
        if(!fs::is_directory(entry))
            continue;
        const auto date = m_settings.cycle_format().cycle_from_date(entry.path().filename().string());
        if (first_cycle > date)
            first_cycle = date;
    }

    // Did we find anything?
    return first_cycle == std::numeric_limits<std::int32_t>::max() ? -1 : first_cycle;
}